

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O0

int evutil_check_interfaces(void)

{
  int iVar1;
  int iVar2;
  socklen_t local_70;
  int r;
  socklen_t sin6_out_len;
  socklen_t sin_out_len;
  sockaddr_in6 sin6_out;
  sockaddr_in6 sin6;
  sockaddr_in sin_out;
  sockaddr_in sin;
  int fd;
  
  r = 0x10;
  local_70 = 0x1c;
  if (have_checked_interfaces == 0) {
    have_checked_interfaces = 1;
    iVar1 = evutil_check_ifaddrs();
    if (iVar1 != 0) {
      memset(sin_out.sin_zero,0,0x10);
      sin_out.sin_zero[0] = '\x02';
      sin_out.sin_zero[1] = '\0';
      sin_out.sin_zero._2_2_ = htons(0x35);
      iVar1 = evutil_inet_pton(2,"18.244.0.188",sin_out.sin_zero + 4);
      if (iVar1 == 0) {
        event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evutil.c"
                   ,0x30e,"r","evutil_check_interfaces");
      }
      memset((void *)((long)&sin6_out.sin6_addr.__in6_u + 0xc),0,0x1c);
      sin6_out.sin6_addr.__in6_u.__u6_addr16[6] = 10;
      sin6_out.sin6_addr.__in6_u.__u6_addr16[7] = htons(0x35);
      iVar1 = evutil_inet_pton(10,"2001:4860:b002::68",&sin6);
      if (iVar1 == 0) {
        event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evutil.c"
                   ,0x314,"r","evutil_check_interfaces");
      }
      memset((void *)((long)&sin6.sin6_addr.__in6_u + 0xc),0,0x10);
      memset(&sin6_out_len,0,0x1c);
      iVar1 = socket(2,2,0x11);
      if (((-1 < iVar1) && (iVar2 = connect(iVar1,(sockaddr *)sin_out.sin_zero,0x10), iVar2 == 0))
         && (iVar2 = getsockname(iVar1,(sockaddr *)((long)&sin6.sin6_addr.__in6_u + 0xc),
                                 (socklen_t *)&r), iVar2 == 0)) {
        evutil_found_ifaddr((sockaddr *)((long)&sin6.sin6_addr.__in6_u + 0xc));
      }
      if (-1 < iVar1) {
        evutil_closesocket(iVar1);
      }
      iVar1 = socket(10,2,0x11);
      if (((-1 < iVar1) &&
          (iVar2 = connect(iVar1,(sockaddr *)((long)&sin6_out.sin6_addr.__in6_u + 0xc),0x1c),
          iVar2 == 0)) &&
         (iVar2 = getsockname(iVar1,(sockaddr *)&sin6_out_len,&local_70), iVar2 == 0)) {
        evutil_found_ifaddr((sockaddr *)&sin6_out_len);
      }
      if (-1 < iVar1) {
        evutil_closesocket(iVar1);
      }
    }
  }
  return 0;
}

Assistant:

static int
evutil_check_interfaces(void)
{
	evutil_socket_t fd = -1;
	struct sockaddr_in sin, sin_out;
	struct sockaddr_in6 sin6, sin6_out;
	ev_socklen_t sin_out_len = sizeof(sin_out);
	ev_socklen_t sin6_out_len = sizeof(sin6_out);
	int r;
	if (have_checked_interfaces)
		return 0;

	/* From this point on we have done the ipv4/ipv6 interface check */
	have_checked_interfaces = 1;

	if (evutil_check_ifaddrs() == 0) {
		/* Use a nice sane interface, if this system has one. */
		return 0;
	}

	/* Ugh. There was no nice sane interface.  So to check whether we have
	 * an interface open for a given protocol, will try to make a UDP
	 * 'connection' to a remote host on the internet.  We don't actually
	 * use it, so the address doesn't matter, but we want to pick one that
	 * keep us from using a host- or link-local interface. */
	memset(&sin, 0, sizeof(sin));
	sin.sin_family = AF_INET;
	sin.sin_port = htons(53);
	r = evutil_inet_pton(AF_INET, "18.244.0.188", &sin.sin_addr);
	EVUTIL_ASSERT(r);

	memset(&sin6, 0, sizeof(sin6));
	sin6.sin6_family = AF_INET6;
	sin6.sin6_port = htons(53);
	r = evutil_inet_pton(AF_INET6, "2001:4860:b002::68", &sin6.sin6_addr);
	EVUTIL_ASSERT(r);

	memset(&sin_out, 0, sizeof(sin_out));
	memset(&sin6_out, 0, sizeof(sin6_out));

	/* XXX some errnos mean 'no address'; some mean 'not enough sockets'. */
	if ((fd = socket(AF_INET, SOCK_DGRAM, IPPROTO_UDP)) >= 0 &&
	    connect(fd, (struct sockaddr*)&sin, sizeof(sin)) == 0 &&
	    getsockname(fd, (struct sockaddr*)&sin_out, &sin_out_len) == 0) {
		/* We might have an IPv4 interface. */
		evutil_found_ifaddr((struct sockaddr*) &sin_out);
	}
	if (fd >= 0)
		evutil_closesocket(fd);

	if ((fd = socket(AF_INET6, SOCK_DGRAM, IPPROTO_UDP)) >= 0 &&
	    connect(fd, (struct sockaddr*)&sin6, sizeof(sin6)) == 0 &&
	    getsockname(fd, (struct sockaddr*)&sin6_out, &sin6_out_len) == 0) {
		/* We might have an IPv6 interface. */
		evutil_found_ifaddr((struct sockaddr*) &sin6_out);
	}

	if (fd >= 0)
		evutil_closesocket(fd);

	return 0;
}